

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_global.c
# Opt level: O1

TA_RetCode
TA_SetCandleSettings
          (TA_CandleSettingType settingType,TA_RangeType rangeType,int avgPeriod,double factor)

{
  TA_LibcPriv *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = TA_Globals;
  TVar2 = TA_BAD_PARAM;
  if (settingType < TA_AllCandleSettings) {
    TA_Globals->candleSettings[settingType].settingType = settingType;
    pTVar1->candleSettings[settingType].rangeType = rangeType;
    pTVar1->candleSettings[settingType].avgPeriod = avgPeriod;
    pTVar1->candleSettings[settingType].factor = factor;
    TVar2 = TA_SUCCESS;
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_SetCandleSettings( TA_CandleSettingType settingType,
                                 TA_RangeType rangeType,
                                 int avgPeriod,
                                 double factor )
{
    /*printf("setcdlset:%d  ",settingType);*/
    if( settingType >= TA_AllCandleSettings )
        return TA_BAD_PARAM;
    TA_Globals->candleSettings[settingType].settingType = settingType;
    TA_Globals->candleSettings[settingType].rangeType = rangeType;
    TA_Globals->candleSettings[settingType].avgPeriod = avgPeriod;
    TA_Globals->candleSettings[settingType].factor = factor;
    /*printf("cdlset: %d %d %d %f\n",TA_Globals->candleSettings[settingType].settingType,TA_Globals->candleSettings[settingType].rangeType,
        TA_Globals->candleSettings[settingType].avgPeriod,TA_Globals->candleSettings[settingType].factor);*/
    return TA_SUCCESS;
}